

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

void __thiscall
GlobOpt::CloneValues
          (GlobOpt *this,BasicBlock *toBlock,GlobOptBlockData *toData,GlobOptBlockData *fromData)

{
  BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  long lVar1;
  SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  Value *pVVar3;
  code *pcVar4;
  bool bVar5;
  BOOLEAN BVar6;
  BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_01;
  undefined4 *puVar7;
  Type pDVar8;
  Type *pTVar9;
  Value **ppVVar10;
  Type pDVar11;
  undefined1 local_c0 [8];
  ValueSetByValueNumber originalValues;
  Iterator local_68;
  Value *local_58;
  Value *value;
  Value *newValue;
  GlobOpt *local_40;
  BVIndex local_34 [2];
  ValueNumber valueNum;
  
  this_01 = (BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             *)new<Memory::JitArenaAllocator>(0x38,this->alloc,0x3eba5c);
  JsUtil::
  BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(this_01,this->alloc,0);
  toData->valuesToKillOnCalls = (ValueSet *)this_01;
  this_00 = &this->valuesCreatedForClone->
             super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ;
  newValue = (Value *)toData;
  local_40 = this;
  if (this_00 ==
      (BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x14dd,"(valuesCreatedForClone)","valuesCreatedForClone");
    if (!bVar5) goto LAB_0041e775;
    *puVar7 = 0;
  }
  if (this_00->count != this_00->freeCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x14de,"(valuesCreatedForClone->Count() == 0)",
                       "valuesCreatedForClone->Count() == 0");
    if (!bVar5) {
LAB_0041e775:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  JsUtil::
  BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    *)local_c0,local_40->tempAlloc,0x40);
  pDVar11 = (Type)(ulong)*(uint *)(*(long *)newValue + 8);
  if (pDVar11 != (Type)0x0) {
    lVar1 = *(long *)(*(long *)newValue + 0x10);
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    pDVar8 = (Type)0x0;
    do {
      local_68.list =
           (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
           ((long)pDVar8 * 0x10 + lVar1);
      originalValues.
      super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      .stats = pDVar8;
      local_68.current = (NodeBase *)local_68.list;
      while( true ) {
        if ((SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
            local_68.current ==
            (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar5) goto LAB_0041e775;
          *puVar7 = 0;
        }
        pSVar2 = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                 ((SListNodeBase<Memory::ArenaAllocator> *)&(local_68.current)->next)->next;
        if (pSVar2 == local_68.list) break;
        local_68.current = (NodeBase *)pSVar2;
        pTVar9 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator
                 ::Data(&local_68);
        local_58 = pTVar9->element;
        local_34[0] = local_58->valueNumber;
        ppVVar10 = JsUtil::
                   BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   ::Lookup((BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                             *)local_c0,local_34);
        pVVar3 = *ppVVar10;
        if (pVVar3 == (Value *)0x0) {
          JsUtil::
          BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::Add((BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 *)local_c0,&local_58);
        }
        else {
          BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                            (local_40->byteCodeConstantValueNumbersBv,local_34[0]);
          if ((BVar6 == '\0') && (local_58 != pVVar3)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                               ,0x14f2,"(value == previouslyClonedOriginalValue)",
                               "value == previouslyClonedOriginalValue");
            if (!bVar5) goto LAB_0041e775;
            *puVar7 = 0;
          }
        }
        ppVVar10 = JsUtil::
                   BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   ::Lookup((BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                             *)this_00,local_34);
        value = *ppVVar10;
        if (value == (Value *)0x0) {
          value = CopyValue(local_40,local_58,local_34[0]);
          TrackMergedValueForKills
                    (local_40,value,(GlobOptBlockData *)newValue,
                     (BVSparse<Memory::JitArenaAllocator> *)0x0);
          JsUtil::
          BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::Add((BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 *)this_00,&value);
        }
        pTVar9->element = value;
      }
      pDVar8 = (Type)((long)&(originalValues.
                              super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                             .stats)->pNext + 1);
    } while (pDVar8 != pDVar11);
  }
  JsUtil::
  BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::Clear(this_00);
  ProcessValueKills(local_40,toBlock,(GlobOptBlockData *)newValue);
  JsUtil::
  BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                     *)local_c0);
  return;
}

Assistant:

void
GlobOpt::CloneValues(BasicBlock *const toBlock, GlobOptBlockData *toData, GlobOptBlockData *fromData)
{
    ValueSet *const valuesToKillOnCalls = JitAnew(this->alloc, ValueSet, this->alloc);
    toData->valuesToKillOnCalls = valuesToKillOnCalls;

    // Values are shared between symbols with the same ValueNumber.
    // Use a dictionary to share the clone values.
    ValueSetByValueNumber *const valuesCreatedForClone = this->valuesCreatedForClone;
    Assert(valuesCreatedForClone);
    Assert(valuesCreatedForClone->Count() == 0);
    DebugOnly(ValueSetByValueNumber originalValues(tempAlloc, 64));

    const uint tableSize = toData->symToValueMap->tableSize;
    SListBase<GlobHashBucket> *const table = toData->symToValueMap->table;
    for (uint i = 0; i < tableSize; i++)
    {
        FOREACH_SLISTBASE_ENTRY(GlobHashBucket, bucket, &table[i])
        {
            Value *value = bucket.element;
            ValueNumber valueNum = value->GetValueNumber();
#if DBG
            // Ensure that the set of values in fromData contains only one value per value number. Byte-code constant values
            // are reused in multiple blocks without cloning, so exclude those value numbers.
            {
                Value *const previouslyClonedOriginalValue = originalValues.Lookup(valueNum);
                if (previouslyClonedOriginalValue)
                {
                    if (!byteCodeConstantValueNumbersBv->Test(valueNum))
                    {
                        Assert(value == previouslyClonedOriginalValue);
                    }
                }
                else
                {
                    originalValues.Add(value);
                }
            }
#endif

            Value *newValue = valuesCreatedForClone->Lookup(valueNum);
            if (!newValue)
            {
                newValue = CopyValue(value, valueNum);
                TrackMergedValueForKills(newValue, toData, nullptr);
                valuesCreatedForClone->Add(newValue);
            }
            bucket.element = newValue;
        } NEXT_SLISTBASE_ENTRY;
    }

    valuesCreatedForClone->Clear();

    ProcessValueKills(toBlock, toData);
}